

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdthreads.cc
# Opt level: O0

pthread_t createThread(bdThread *thread)

{
  void *data;
  pthread_t tid;
  bdThread *thread_local;
  
  tid = (pthread_t)thread;
  bdMutex::lock(&thread->mMutex);
  pthread_create((pthread_t *)&data,(pthread_attr_t *)0x0,bdthread_init,thread);
  *(void **)(tid + 8) = data;
  bdMutex::unlock((bdMutex *)(tid + 0x10));
  return (pthread_t)data;
}

Assistant:

pthread_t createThread(bdThread &thread) {
    pthread_t tid;
    void  *data = (void *) (&thread);

#ifdef DEBUG_THREADS
    std::cerr << "createThread() creating a bdThread";
    std::cerr << std::endl;
#endif

    thread.mMutex.lock();
    {
      	pthread_create(&tid, 0, &bdthread_init, data);
      	thread.mTid = tid;
    }

#ifdef DEBUG_THREADS
    std::cerr << "createThread() created Thread.mTid: ";

#if defined(_WIN32) || defined(__MINGW32__)
    std::cerr << "WIN32: Cannot print mTid ";
#else
    std::cerr << thread.mTid;
#endif
    std::cerr << std::endl;

#endif

    thread.mMutex.unlock();

    return tid;

}